

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.h
# Opt level: O3

bool __thiscall
google::protobuf::compiler::cpp::FileGenerator::IsDepWeak(FileGenerator *this,FileDescriptor *dep)

{
  undefined1 extraout_AL;
  size_t sVar1;
  Options *key;
  undefined8 *puVar2;
  FileDescriptor *local_20;
  
  key = (Options *)&stack0xffffffffffffffe0;
  local_20 = dep;
  sVar1 = absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
          ::count<google::protobuf::FileDescriptor_const*>
                    ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                      *)this,(key_arg<const_google::protobuf::FileDescriptor_*> *)key);
  if ((sVar1 != 0) && ((this->options_).opensource_runtime == true)) {
    puVar2 = (undefined8 *)&stack0xffffffffffffffe8;
    IsDepWeak();
    *puVar2 = 1;
    puVar2[1] = 0;
    puVar2[8] = 0;
    puVar2[9] = 0;
    puVar2[10] = 0;
    puVar2[4] = 0;
    puVar2[5] = 0;
    *(undefined8 *)((long)puVar2 + 0x2c) = 0;
    *(undefined8 *)((long)puVar2 + 0x34) = 0;
    Options::Options((Options *)(puVar2 + 0xb),key);
    puVar2[0x25] = 1;
    puVar2[0x26] = 0;
    return (bool)extraout_AL;
  }
  return sVar1 != 0;
}

Assistant:

bool IsDepWeak(const FileDescriptor* dep) const {
    if (weak_deps_.count(dep) != 0) {
      ABSL_CHECK(!options_.opensource_runtime);
      return true;
    }
    return false;
  }